

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

Action<int_(int,_int)> __thiscall
testing::PolymorphicAction::operator_cast_to_Action(PolymorphicAction *this)

{
  MonomorphicImpl<int_(int,_int)> *this_00;
  linked_ptr_internal extraout_RDX;
  InvokeAction<int_(*)(int,_int)> *in_RSI;
  Action<int_(int,_int)> AVar1;
  PolymorphicAction<testing::internal::InvokeAction<int_(*)(int,_int)>_> *this_local;
  
  this_00 = (MonomorphicImpl<int_(int,_int)> *)operator_new(0x10);
  PolymorphicAction<testing::internal::InvokeAction<int_(*)(int,_int)>_>::
  MonomorphicImpl<int_(int,_int)>::MonomorphicImpl(this_00,in_RSI);
  Action<int_(int,_int)>::Action
            ((Action<int_(int,_int)> *)this,(ActionInterface<int_(int,_int)> *)this_00);
  AVar1.impl_.link_.next_ = extraout_RDX.next_;
  AVar1.impl_.value_ = (ActionInterface<int_(int,_int)> *)this;
  return (Action<int_(int,_int)>)AVar1.impl_;
}

Assistant:

operator Action<F>() const {
    return Action<F>(new MonomorphicImpl<F>(impl_));
  }